

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O3

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
     ::match(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
             candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>_&>
            *matchers)

{
  BinaryOp BVar1;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> pBVar2;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
  *pMVar3;
  matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *ppEVar4;
  matched_t<wasm::Const_*> pCVar5;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>_>
  *pMVar6;
  matched_t<wasm::Const_*> *ppCVar7;
  bool bVar8;
  BinaryOp BVar9;
  Literal local_48;
  
  pBVar2 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            )candidate->left;
  if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId)
  {
    pMVar3 = matchers->curr;
    if (pMVar3->binder !=
        (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_> *
        )0x0) {
      *pMVar3->binder = pBVar2;
    }
    BVar1 = pBVar2->op;
    BVar9 = Abstract::getBinary((Type)(pBVar2->left->type).id,pMVar3->data);
    if (BVar1 == BVar9) {
      ppEVar4 = ((pMVar3->submatchers).curr)->binder;
      if (ppEVar4 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
        *ppEVar4 = pBVar2->left;
      }
      ppEVar4 = ((pMVar3->submatchers).next.curr)->binder;
      if (ppEVar4 != (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)0x0) {
        *ppEVar4 = pBVar2->right;
      }
      pCVar5 = (matched_t<wasm::Const_*>)candidate->right;
      if ((pCVar5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
          ConstId) {
        pMVar6 = (matchers->next).curr;
        ppCVar7 = pMVar6->binder;
        if (ppCVar7 != (matched_t<wasm::Const_*> *)0x0) {
          *ppCVar7 = pCVar5;
        }
        Literal::Literal(&local_48,&pCVar5->value);
        bVar8 = Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<long>_>_>
                ::matches(&(pMVar6->submatchers).curr,&local_48);
        Literal::~Literal(&local_48);
        return bVar8;
      }
    }
  }
  return false;
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }